

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  undefined8 *in_RDI;
  int in_stack_00001264;
  string *in_stack_00001268;
  SceneLoadingTutorialApplication *in_stack_00001270;
  string *in_stack_fffffffffffffe88;
  anon_class_1_0_00000001_for_f *in_stack_fffffffffffffe90;
  allocator *f;
  string *in_stack_fffffffffffffe98;
  string *name;
  Application *in_stack_fffffffffffffea0;
  Application *this_00;
  allocator local_129;
  string local_128 [39];
  undefined1 local_101 [40];
  undefined1 local_d9 [40];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"pathtracer",&local_29);
  SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
            (in_stack_00001270,in_stack_00001268,in_stack_00001264);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *in_RDI = &PTR__Tutorial_006454f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"spp",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"--spp <int>: sets number of samples per pixel",&local_89);
  Application::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (anon_class_1_0_00000001_for_f *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"max-path-length",&local_b1);
  this_00 = (Application *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d9 + 1),
             "--max-path-length <int>: sets maximal path length (1=primary+shadow)",
             (allocator *)this_00);
  Application::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  name = (string *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_101 + 1),"accumulate",(allocator *)name);
  f = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,"--accumulate <bool>: accumulate samples (on by default)",f);
  Application::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_3_>
            (this_00,name,(anon_class_1_0_00000001_for_f *)f,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES)
    {
      registerOption("spp", [] (Ref<ParseStream> cin, const FileName& path) {
          g_spp = cin->getInt();
        }, "--spp <int>: sets number of samples per pixel");

      registerOption("max-path-length", [] (Ref<ParseStream> cin, const FileName& path) {
          g_max_path_length = cin->getInt();
        }, "--max-path-length <int>: sets maximal path length (1=primary+shadow)");

      registerOption("accumulate", [] (Ref<ParseStream> cin, const FileName& path) {
          g_accumulate = cin->getInt();
        }, "--accumulate <bool>: accumulate samples (on by default)");
    }